

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

bool Path::is_file(string *path)

{
  int iVar1;
  char *__file;
  bool local_a1;
  undefined1 local_a0 [8];
  stat s;
  string *path_local;
  
  s.__glibc_reserved[2] = (__syscall_slong_t)path;
  memset(local_a0,0,0x90);
  __file = (char *)std::__cxx11::string::c_str();
  iVar1 = stat(__file,(stat *)local_a0);
  local_a1 = iVar1 == 0 && ((uint)s.st_nlink & 0x8000) != 0;
  return local_a1;
}

Assistant:

bool is_file(const std::string &path)
{
#ifdef _WIN32
	struct __stat64 s;
	if (_stat64(path.c_str(), &s) < 0)
		return false;
	return (s.st_mode & _S_IFREG) != 0;
#else
	struct stat s = {};
	return ::stat(path.c_str(), &s) == 0 && (s.st_mode & S_IFREG) != 0;
#endif
}